

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  stbi_uc sVar2;
  byte bVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  undefined7 extraout_var;
  uint *puVar16;
  char *pcVar17;
  undefined8 extraout_RDX;
  undefined7 uVar19;
  uchar *puVar18;
  uint x_00;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  stbi_uc *psVar24;
  int iVar25;
  int z;
  uint y_00;
  ulong uVar26;
  uint *data;
  char cVar27;
  undefined4 uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  uchar raw_data [4];
  uint local_84;
  stbi_uc local_74 [4];
  stbi_uc *local_70;
  uint *local_68;
  undefined4 local_5c;
  uint *local_58;
  undefined4 local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = (uint *)y;
  local_58 = (uint *)x;
  local_4c = req_comp;
  sVar2 = stbi__get8(s);
  local_70 = (stbi_uc *)CONCAT71(local_70._1_7_,sVar2);
  sVar2 = stbi__get8(s);
  uVar29 = CONCAT71(extraout_var,sVar2) & 0xffffffff;
  bVar3 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  bVar6 = stbi__get8(s);
  bVar7 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar8 = stbi__get8(s);
  bVar9 = stbi__get8(s);
  bVar10 = stbi__get8(s);
  bVar11 = stbi__get8(s);
  bVar12 = stbi__get8(s);
  bVar13 = stbi__get8(s);
  local_74[0] = '\0';
  local_74[1] = '\0';
  local_74[2] = '\0';
  local_74[3] = '\0';
  cVar27 = (char)uVar29;
  uVar19 = (undefined7)((ulong)extraout_RDX >> 8);
  if (cVar27 == '\0') {
    if (bVar12 < 0x10) {
      if (bVar12 != 8) {
        if (bVar12 == 0xf) goto LAB_0018eac5;
        goto LAB_0018ead8;
      }
LAB_0018ead1:
      uVar20 = 1;
    }
    else if ((bVar12 == 0x20) || (bVar12 == 0x18)) {
      uVar20 = (uint)(bVar12 >> 3);
    }
    else {
      if (bVar12 != 0x10) goto LAB_0018ead8;
      uVar20 = bVar3 - 8;
      if (bVar3 < 8) {
        uVar20 = (uint)bVar3;
      }
      if (uVar20 != 3) goto LAB_0018eac5;
      uVar20 = uVar20 == 3 ^ 3;
    }
LAB_0018eae5:
    local_5c = (undefined4)CONCAT71(uVar19,1);
    uVar28 = 0;
  }
  else {
    uVar20 = (uint)bVar7;
    if (uVar20 < 0x18) {
      if (uVar20 - 0xf < 2) {
LAB_0018eac5:
        uVar20 = 3;
        uVar28 = (undefined4)CONCAT71((int7)(uVar29 >> 8),1);
        local_5c = 0;
        goto LAB_0018eae8;
      }
      if (uVar20 == 8) goto LAB_0018ead1;
    }
    else if ((uVar20 == 0x18) || (uVar20 == 0x20)) {
      uVar20 = (uint)(bVar7 >> 3);
      goto LAB_0018eae5;
    }
LAB_0018ead8:
    local_5c = (undefined4)CONCAT71(uVar19,1);
    uVar28 = 0;
    uVar20 = 0;
  }
LAB_0018eae8:
  if (uVar20 == 0) {
    pcVar17 = "Can\'t find out TGA pixelformat";
    goto LAB_0018ecdc;
  }
  local_38 = (ulong)bVar8;
  local_48 = (ulong)bVar10;
  local_40 = (ulong)((uint)bVar11 * 0x100);
  x_00 = (uint)bVar9 * 0x100 + (uint)bVar8;
  y_00 = (uint)bVar11 * 0x100 + (uint)bVar10;
  *local_58 = x_00;
  *local_68 = y_00;
  if (comp != (int *)0x0) {
    *comp = uVar20;
  }
  iVar14 = stbi__mad3sizes_valid(x_00,y_00,uVar20,0);
  if (iVar14 != 0) {
    local_68 = (uint *)stbi__malloc_mad3(x_00,y_00,uVar20,0);
    if (local_68 == (uint *)0x0) {
LAB_0018ecd5:
      pcVar17 = "Out of memory";
      goto LAB_0018ecdc;
    }
    stbi__skip(s,(uint)(byte)local_70);
    data = local_68;
    local_50 = uVar28;
    if ((bVar3 < 8 && cVar27 == '\0') && (char)uVar28 == '\0') {
      if (y_00 != 0) {
        iVar14 = (int)local_40 + (int)local_48;
        iVar25 = 0;
        do {
          iVar14 = iVar14 + -1;
          iVar23 = iVar25;
          if ((bVar13 >> 5 & 1) == 0) {
            iVar23 = iVar14;
          }
          stbi__getn(s,(stbi_uc *)((long)data + (long)(int)(iVar23 * uVar20 * x_00)),uVar20 * x_00);
          iVar25 = iVar25 + 1;
        } while (iVar14 != 0);
      }
      goto LAB_0018eee9;
    }
    uVar21 = (uint)bVar6 * 0x100 + (uint)bVar5;
    if (cVar27 == '\0') {
      local_70 = (stbi_uc *)0x0;
      psVar24 = local_70;
    }
    else {
      puVar16 = local_68;
      if (uVar21 == 0) {
LAB_0018ecbf:
        free(puVar16);
        goto LAB_0018ecc4;
      }
      stbi__skip(s,(uint)CONCAT11(sVar4,sVar2));
      puVar16 = (uint *)stbi__malloc_mad2(uVar21,uVar20,0);
      if (puVar16 == (uint *)0x0) {
        free(data);
        goto LAB_0018ecd5;
      }
      if ((char)local_5c == '\0') {
        if (uVar20 != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                        ,0x1746,
                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        uVar15 = (uint)CONCAT11(bVar6,bVar5);
        local_70 = (stbi_uc *)puVar16;
        do {
          stbi__tga_read_rgb16(s,(stbi_uc *)puVar16);
          puVar16 = (uint *)((long)puVar16 + 3);
          uVar15 = uVar15 - 1;
          psVar24 = local_70;
        } while (uVar15 != 0);
      }
      else {
        iVar14 = stbi__getn(s,(stbi_uc *)puVar16,uVar20 * uVar21);
        psVar24 = (stbi_uc *)puVar16;
        if (iVar14 == 0) {
          free(data);
          goto LAB_0018ecbf;
        }
      }
    }
    local_70 = psVar24;
    if (y_00 * x_00 != 0) {
      uVar29 = (ulong)(uVar20 + (uVar20 == 0));
      local_58 = (uint *)(ulong)(y_00 * x_00);
      puVar16 = (uint *)0x0;
      bVar5 = 0;
      local_84 = 0;
      iVar14 = 0;
      do {
        if (bVar3 < 8) {
LAB_0018ed8b:
          bVar30 = false;
        }
        else {
          if (iVar14 == 0) {
            bVar5 = stbi__get8(s);
            iVar14 = (bVar5 & 0x7f) + 1;
            local_84 = (uint)(bVar5 >> 7);
            goto LAB_0018ed8b;
          }
          bVar30 = (bool)(bVar5 & local_84 != 0);
          local_84 = (uint)(local_84 != 0);
        }
        if (!bVar30) {
          if (cVar27 == '\0') {
            if ((char)local_5c == '\0') {
              if (uVar20 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                              ,0x1777,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              stbi__tga_read_rgb16(s,local_74);
            }
            else {
              uVar26 = 0;
              do {
                sVar2 = stbi__get8(s);
                local_74[uVar26] = sVar2;
                uVar26 = uVar26 + 1;
              } while (uVar29 != uVar26);
            }
          }
          else {
            bVar5 = stbi__get8(s);
            uVar15 = (uint)bVar5;
            if (bVar12 != 8) {
              sVar2 = stbi__get8(s);
              uVar15 = (uint)CONCAT11(sVar2,bVar5);
            }
            if (uVar21 <= uVar15) {
              uVar15 = 0;
            }
            memcpy(local_74,local_70 + uVar15 * uVar20,uVar29);
          }
        }
        data = local_68;
        memcpy((stbi_uc *)((long)local_68 + (ulong)(uVar20 * (int)puVar16)),local_74,uVar29);
        iVar14 = iVar14 + -1;
        puVar16 = (uint *)((long)puVar16 + 1);
        bVar5 = 1;
      } while (puVar16 != local_58);
    }
    if (y_00 != 0 && (bVar13 >> 5 & 1) == 0) {
      iVar14 = uVar20 * x_00;
      uVar15 = ((int)local_40 + (int)local_48) - 1;
      iVar25 = ((uint)bVar9 * 0x100 | (uint)local_38) * uVar20 * uVar15;
      uVar22 = 0;
      uVar21 = 0;
      do {
        if (iVar14 != 0) {
          psVar24 = (stbi_uc *)data;
          iVar23 = iVar14 + 1;
          do {
            sVar2 = psVar24[uVar22];
            psVar24[uVar22] = psVar24[iVar25];
            psVar24[iVar25] = sVar2;
            psVar24 = psVar24 + 1;
            iVar23 = iVar23 + -1;
          } while (1 < iVar23);
        }
        iVar25 = iVar25 - iVar14;
        uVar22 = uVar22 + iVar14;
        bVar30 = uVar21 != uVar15 >> 1;
        uVar21 = uVar21 + 1;
      } while (bVar30);
    }
    if (local_70 != (stbi_uc *)0x0) {
      free(local_70);
    }
LAB_0018eee9:
    if (((char)local_50 == '\0' && 2 < uVar20) && (iVar14 = y_00 * x_00, iVar14 != 0)) {
      puVar18 = (uchar *)((long)data + 2);
      do {
        uVar1 = puVar18[-2];
        puVar18[-2] = *puVar18;
        *puVar18 = uVar1;
        puVar18 = puVar18 + uVar20;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    if (local_4c == 0) {
      return (uchar *)data;
    }
    if (uVar20 == local_4c) {
      return (uchar *)data;
    }
    puVar18 = stbi__convert_format((uchar *)data,uVar20,local_4c,x_00,y_00);
    return puVar18;
  }
LAB_0018ecc4:
  pcVar17 = "Corrupt TGA";
LAB_0018ecdc:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}